

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O1

int ecp_mod_p224(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  mbedtls_mpi_uint mVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  char cVar21;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [4];
  uint local_80;
  mbedtls_mpi local_70;
  mbedtls_mpi_uint local_58 [5];
  
  local_70.s = 1;
  local_70.n = 4;
  local_70.p = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  iVar4 = mbedtls_mpi_grow(N,7);
  if (iVar4 == 0) {
    pmVar2 = N->p;
    mVar3 = *pmVar2;
    uVar10 = (uint)mVar3;
    uVar7 = (uint)(pmVar2[3] >> 0x20);
    uVar13 = uVar10 - uVar7;
    uVar8 = (uint)(pmVar2[5] >> 0x20);
    uVar17 = -(uint)(uVar13 < uVar8) - (uint)(uVar10 < uVar7);
    *(uint *)pmVar2 = uVar13 - uVar8;
    uVar11 = (uint)(mVar3 >> 0x20);
    if ((uVar10 < uVar7) || (uVar13 < uVar8)) {
      cVar21 = -(uVar11 < -uVar17);
    }
    else {
      cVar21 = CARRY4(uVar17,uVar11);
    }
    uVar9 = pmVar2[1];
    uVar16 = (uint)pmVar2[4];
    uVar18 = (uVar17 + uVar11) - uVar16;
    uVar10 = (uint)pmVar2[6];
    cVar21 = (cVar21 - (uVar17 + uVar11 < uVar16)) - (uVar18 < uVar10);
    *pmVar2 = CONCAT44(uVar18 - uVar10,uVar13 - uVar8);
    uVar13 = (uint)cVar21;
    uVar11 = (uint)uVar9;
    if (cVar21 < '\0') {
      cVar21 = -(uVar11 < -uVar13);
    }
    else {
      cVar21 = CARRY4(uVar13,uVar11);
    }
    uVar18 = (uint)(pmVar2[4] >> 0x20);
    uVar19 = (uVar13 + uVar11) - uVar18;
    uVar17 = (uint)(pmVar2[6] >> 0x20);
    uVar20 = uVar19 - uVar17;
    cVar21 = (cVar21 - (uVar13 + uVar11 < uVar18)) - (uVar19 < uVar17);
    pmVar2[1] = uVar9 & 0xffffffff00000000 | (ulong)uVar20;
    uVar13 = (uint)cVar21;
    uVar11 = (uint)(uVar9 >> 0x20);
    if (cVar21 < '\0') {
      cVar21 = -(uVar11 < -uVar13);
    }
    else {
      cVar21 = CARRY4(uVar13,uVar11);
    }
    uVar19 = (uint)pmVar2[5];
    uVar14 = (uVar13 + uVar11) - uVar19;
    uVar15 = uVar14 + uVar7;
    cVar21 = CARRY4(uVar14,uVar7) + (cVar21 - (uVar13 + uVar11 < uVar19)) + CARRY4(uVar15,uVar8);
    pmVar2[1] = CONCAT44(uVar15 + uVar8,uVar20);
    uVar9 = pmVar2[2];
    uVar11 = (uint)cVar21;
    uVar7 = (uint)uVar9;
    if (cVar21 < '\0') {
      cVar21 = -(uVar7 < -uVar11);
    }
    else {
      cVar21 = CARRY4(uVar11,uVar7);
    }
    uVar13 = (uVar11 + uVar7) - uVar8;
    uVar20 = uVar13 + uVar16;
    uVar14 = uVar20 + uVar10;
    cVar21 = CARRY4(uVar13,uVar16) + (cVar21 - (uVar11 + uVar7 < uVar8)) + CARRY4(uVar20,uVar10);
    pmVar2[2] = uVar9 & 0xffffffff00000000 | (ulong)uVar14;
    uVar11 = (uint)cVar21;
    uVar8 = (uint)(uVar9 >> 0x20);
    if (cVar21 < '\0') {
      cVar21 = -(uVar8 < -uVar11);
    }
    else {
      cVar21 = CARRY4(uVar11,uVar8);
    }
    uVar7 = (uVar11 + uVar8) - uVar10;
    uVar13 = uVar7 + uVar18;
    cVar21 = CARRY4(uVar7,uVar18) + (cVar21 - (uVar11 + uVar8 < uVar10)) + CARRY4(uVar13,uVar17);
    pmVar2[2] = CONCAT44(uVar13 + uVar17,uVar14);
    uVar11 = (uint)cVar21;
    local_80 = (uint)pmVar2[3];
    if (cVar21 < '\0') {
      cVar21 = -(local_80 < -uVar11);
    }
    else {
      cVar21 = CARRY4(uVar11,local_80);
    }
    uVar8 = (uVar11 + local_80) - uVar17;
    cVar6 = (cVar21 - (uVar11 + local_80 < uVar17)) + CARRY4(uVar8,uVar19);
    cVar21 = '\0';
    if ('\0' < cVar6) {
      cVar21 = cVar6;
    }
    pmVar2[3] = (ulong)CONCAT14(cVar21,uVar8 + uVar19);
    if (8 < N->n * 2) {
      uVar9 = 7;
      do {
        uVar12 = 0xffffffff00000000;
        if ((uVar9 & 1) == 0) {
          uVar12 = 0xffffffff;
        }
        puVar1 = (ulong *)((long)pmVar2 + (uVar9 + 1 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar12;
        uVar12 = uVar9 + 2;
        uVar9 = uVar9 + 1;
      } while (uVar12 < N->n * 2);
    }
    if (cVar6 < '\0') {
      local_70.p[local_70.n - 1] = (long)cVar6 * -0x100000000;
      iVar5 = mbedtls_mpi_sub_abs(N,&local_70,N);
      if (iVar5 == 0) {
        N->s = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int ecp_mod_p224( mbedtls_mpi *N )
{
    INIT( 224 );

    SUB(  7 ); SUB( 11 );               NEXT; // A0 += -A7 - A11
    SUB(  8 ); SUB( 12 );               NEXT; // A1 += -A8 - A12
    SUB(  9 ); SUB( 13 );               NEXT; // A2 += -A9 - A13
    SUB( 10 ); ADD(  7 ); ADD( 11 );    NEXT; // A3 += -A10 + A7 + A11
    SUB( 11 ); ADD(  8 ); ADD( 12 );    NEXT; // A4 += -A11 + A8 + A12
    SUB( 12 ); ADD(  9 ); ADD( 13 );    NEXT; // A5 += -A12 + A9 + A13
    SUB( 13 ); ADD( 10 );               LAST; // A6 += -A13 + A10

cleanup:
    return( ret );
}